

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::CallGetter
              (RecyclableObject *function,Var object,ScriptContext *requestContext)

{
  anon_class_40_5_fb1af45c implicitCall;
  bool bVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  ThreadContext *threadContext;
  ScriptContext *scriptContext;
  ScriptContext *requestContext_local;
  Var object_local;
  RecyclableObject *function_local;
  
  pSVar2 = RecyclableObject::GetScriptContext(function);
  bVar1 = ScriptContext::ShouldSuppressGetterInvocationForDebuggerEvaluation(pSVar2);
  if (bVar1) {
    this = ScriptContext::GetLibrary(requestContext);
    function_local = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  else {
    pSVar2 = RecyclableObject::GetScriptContext(function);
    this_00 = ScriptContext::GetThreadContext(pSVar2);
    implicitCall.threadContext = this_00;
    implicitCall.object = object;
    implicitCall.function = function;
    implicitCall.scriptContext = pSVar2;
    implicitCall.requestContext = requestContext;
    function_local =
         (RecyclableObject *)
         ThreadContext::
         ExecuteImplicitCall<Js::JavascriptOperators::CallGetter(Js::RecyclableObject*,void*,Js::ScriptContext*)::__0>
                   (this_00,function,ImplicitCall_Accessor,implicitCall);
  }
  return function_local;
}

Assistant:

Var JavascriptOperators::CallGetter(RecyclableObject * const function, Var const object, ScriptContext * requestContext)
    {
#if ENABLE_TTD
        if(function->GetScriptContext()->ShouldSuppressGetterInvocationForDebuggerEvaluation())
        {
            return requestContext->GetLibrary()->GetUndefined();
        }
#endif

        ScriptContext * scriptContext = function->GetScriptContext();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(function, ImplicitCall_Accessor, [=]() -> Js::Var
        {
            // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
            // Stack numbers are ok, as we will call ToObject to wrap it in a number object anyway
            // See JavascriptOperators::GetThisHelper
            Assert(JavascriptOperators::GetTypeId(object) == TypeIds_Integer ||
                JavascriptOperators::GetTypeId(object) == TypeIds_Number ||
                threadContext->HasNoSideEffect(function) ||
                !ThreadContext::IsOnStack(object));

            // Verify that the scriptcontext is alive before firing getter/setter
            if (!scriptContext->VerifyAlive(!function->IsExternal(), requestContext))
            {
                return nullptr;
            }
            CallFlags flags = CallFlags_Value;

            Var thisVar = RootToThisObject(object, scriptContext);

            RecyclableObject* marshalledFunction = UnsafeVarTo<RecyclableObject>(
              CrossSite::MarshalVar(requestContext, function, scriptContext));

            Var result = CALL_ENTRYPOINT(threadContext, marshalledFunction->GetEntryPoint(), function, CallInfo(flags, 1), thisVar);
            result = CrossSite::MarshalVar(requestContext, result);

            // Set implicit call flags so we bail out if we're trying to propagate the value forward, e.g., from a compare. Subsequent calls
            // to the getter may produce different results.
            threadContext->AddImplicitCallFlags(ImplicitCall_Accessor);

            return result;
        });
    }